

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test3::writeVaryingPassthrough
          (GPUShaderFP64Test3 *this,ostream *stream,shaderStage shader_stage)

{
  ostream *poVar1;
  undefined **ppuVar2;
  undefined **ppuVar3;
  undefined **ppuVar4;
  undefined **ppuVar5;
  char *pcVar6;
  
  ppuVar4 = &m_varying_name_tcs_tes_vs_result;
  if (shader_stage == TESS_EVAL_SHADER) {
    ppuVar3 = &m_varying_name_tes_gs_vs_result;
    ppuVar2 = &m_varying_name_tcs_tes_tcs_result;
    ppuVar5 = &m_varying_name_tes_gs_tcs_result;
  }
  else {
    if (shader_stage == TESS_CONTROL_SHADER) {
      ppuVar2 = &m_varying_name_vs_tcs_vs_result;
      pcVar6 = "[gl_InvocationID] = ";
      ppuVar3 = ppuVar4;
      goto LAB_009e3301;
    }
    if (shader_stage != GEOMETRY_SHADER) {
      return;
    }
    poVar1 = std::operator<<(stream,"    ");
    poVar1 = std::operator<<(poVar1,m_varying_name_gs_fs_tcs_result);
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,m_varying_name_tes_gs_tcs_result);
    std::operator<<(poVar1,"[0];\n");
    ppuVar4 = &m_varying_name_tes_gs_vs_result;
    ppuVar3 = &m_varying_name_gs_fs_vs_result;
    ppuVar2 = &m_varying_name_tes_gs_tes_result;
    ppuVar5 = &m_varying_name_gs_fs_tes_result;
  }
  poVar1 = std::operator<<(stream,"    ");
  poVar1 = std::operator<<(poVar1,*ppuVar5);
  pcVar6 = " = ";
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::operator<<(poVar1,*ppuVar2);
  std::operator<<(poVar1,"[0];\n");
  ppuVar2 = ppuVar4;
LAB_009e3301:
  poVar1 = std::operator<<(stream,"    ");
  poVar1 = std::operator<<(poVar1,*ppuVar3);
  poVar1 = std::operator<<(poVar1,pcVar6);
  poVar1 = std::operator<<(poVar1,*ppuVar2);
  std::operator<<(poVar1,"[0];\n");
  return;
}

Assistant:

void GPUShaderFP64Test3::writeVaryingPassthrough(std::ostream& stream, shaderStage shader_stage) const
{
	switch (shader_stage)
	{
	case FRAGMENT_SHADER:
		break;

	case GEOMETRY_SHADER:

		stream << "    " << m_varying_name_gs_fs_tcs_result << " = " << m_varying_name_tes_gs_tcs_result << "[0];\n";
		stream << "    " << m_varying_name_gs_fs_tes_result << " = " << m_varying_name_tes_gs_tes_result << "[0];\n";
		stream << "    " << m_varying_name_gs_fs_vs_result << " = " << m_varying_name_tes_gs_vs_result << "[0];\n";

		break;

	case TESS_CONTROL_SHADER:

		stream << "    " << m_varying_name_tcs_tes_vs_result
			   << "[gl_InvocationID] = " << m_varying_name_vs_tcs_vs_result << "[0];\n";

		break;

	case TESS_EVAL_SHADER:

		stream << "    " << m_varying_name_tes_gs_tcs_result << " = " << m_varying_name_tcs_tes_tcs_result << "[0];\n";
		stream << "    " << m_varying_name_tes_gs_vs_result << " = " << m_varying_name_tcs_tes_vs_result << "[0];\n";

		break;

	case VERTEX_SHADER:

		break;
	}
}